

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O2

void ssh2_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  int *s;
  int iVar1;
  long *plVar2;
  PacketQueueNode *pPVar3;
  toplevel_callback_fn_t p_Var4;
  LogContext *ctx;
  _Bool _Var5;
  char cVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  PktIn *pPVar12;
  bufchain *pbVar13;
  PacketQueueNode *pPVar14;
  char *pcVar15;
  byte bVar16;
  undefined1 *puVar17;
  BinaryPacketProtocolVtable *pBVar18;
  long lVar19;
  IdempotentCallback *pIVar20;
  size_t addend;
  PacketQueueNode *pPVar21;
  Ssh *pSVar22;
  byte bVar23;
  ptrlen pkt;
  int newlen;
  uchar len [4];
  int iStack_64;
  
  bVar23 = 0;
  iVar1 = bpp[-2].remote_bugs;
  if (iVar1 == 0x2c9) {
LAB_0011c46a:
    pPVar12 = (*(bpp->in_pq).after)(&(bpp->in_pq).pqb,(PacketQueueNode *)&bpp->in_pq,false);
    if (pPVar12 != (PktIn *)0x0) {
      return;
    }
    if (bpp->expect_close != false) {
      ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
      return;
    }
    ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
    return;
  }
  s = &bpp[-2].remote_bugs;
  if (iVar1 == 0x149) goto LAB_0011c0f3;
  if (iVar1 == 0x152) goto LAB_0011c4bc;
  if (iVar1 == 0x17d) goto LAB_0011c05e;
  if (iVar1 == 0x1a9) goto LAB_0011c390;
  if (iVar1 == 0x1c2) goto LAB_0011c175;
  if (iVar1 == 0x1eb) goto LAB_0011c257;
  if (iVar1 == 0x272) {
    if (bpp[-1].ic_out_pq.field_0x11 != '\0') {
      return;
    }
  }
  else if (iVar1 != 0) {
    *s = 0;
    return;
  }
LAB_0011bfbe:
  bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)0x0;
  bpp[-1].in_pq.pqb.end.formal_size = 0;
  plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
  uVar7 = 8;
  if (plVar2 != (long *)0x0) {
    uVar7 = 8;
    if (8 < *(uint *)(*plVar2 + 0x48)) {
      uVar7 = *(uint *)(*plVar2 + 0x48);
    }
  }
  *(uint *)&bpp[-1].in_pq.after = uVar7;
  pIVar20 = bpp[-1].out_pq.pqb.ic;
  pPVar21 = (PacketQueueNode *)0x0;
  if (pIVar20 != (IdempotentCallback *)0x0) {
    pPVar21 = (PacketQueueNode *)(long)*(int *)(pIVar20->fn + 0x40);
  }
  bpp[-1].in_pq.pqb.end.next = pPVar21;
  if ((plVar2 != (long *)0x0) && ((*(byte *)(*plVar2 + 0x54) & 1) != 0)) {
    if (pIVar20 != (IdempotentCallback *)0x0) {
      bVar16 = *(byte *)&bpp[-1].out_pq.after;
      if (bVar16 != 0) goto LAB_0011c020;
      uVar11 = (ulong)((int)pPVar21 + 0x9000);
      if (bpp[-1].in_pq.pqb.total_size < uVar11) {
        bpp[-1].in_pq.pqb.total_size = uVar11;
        pvVar10 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,uVar11,1);
        *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar10;
      }
      *s = 0x149;
LAB_0011c0f3:
      _Var5 = bufchain_try_fetch_consume
                        (bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                         (size_t)bpp[-1].in_pq.pqb.end.next);
      if (_Var5) {
        ssh_check_frozen(bpp->ssh);
        *(undefined8 *)&bpp[-1].input_eof = 0;
        (**(code **)((bpp[-1].out_pq.pqb.ic)->fn + 0x18))();
        BinarySink_put_uint32
                  ((BinarySink *)(bpp[-1].out_pq.pqb.ic)->ctx,
                   *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue);
        do {
          *s = 0x152;
LAB_0011c4bc:
          _Var5 = bufchain_try_fetch_consume
                            (bpp->in_raw,
                             (void *)((long)&(bpp[-1].in_pq.pqb.end.next)->next +
                                     *(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                     *(long *)&bpp[-1].input_eof),
                             (ulong)*(uint *)&bpp[-1].in_pq.after);
          if (!_Var5) break;
          ssh_check_frozen(bpp->ssh);
          plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
          (**(code **)(*plVar2 + 0x28))
                    (plVar2,*(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                            *(long *)&bpp[-1].input_eof,*(undefined4 *)&bpp[-1].in_pq.after);
          BinarySink_put_data((BinarySink *)(bpp[-1].out_pq.pqb.ic)->ctx,
                              (void *)(*(long *)&bpp[-1].in_pq.pqb.end.on_free_queue +
                                      *(long *)&bpp[-1].input_eof),
                              (ulong)*(uint *)&bpp[-1].in_pq.after);
          lVar19 = (ulong)*(uint *)&bpp[-1].in_pq.after + *(long *)&bpp[-1].input_eof;
          *(long *)&bpp[-1].input_eof = lVar19;
          _Var5 = ssh2_mac_verresult((ssh2_mac *)bpp[-1].out_pq.pqb.ic,
                                     (void *)(lVar19 + *(long *)&bpp[-1].in_pq.pqb.end.on_free_queue
                                             ));
          if (_Var5) {
            uVar8 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
            bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)(int)uVar8;
            lVar19 = *(long *)&bpp[-1].input_eof;
            if ((BinaryPacketProtocolVtable *)(lVar19 + -4) ==
                (BinaryPacketProtocolVtable *)(long)(int)uVar8) goto code_r0x0011c588;
          }
          else {
            lVar19 = *(long *)&bpp[-1].input_eof;
          }
          if (0x8fff < lVar19) {
            pSVar22 = bpp->ssh;
            pcVar15 = "No valid incoming packet found";
            goto LAB_0011c95d;
          }
        } while( true );
      }
      goto LAB_0011c459;
    }
LAB_0011c146:
    uVar11 = (ulong)uVar7;
    if (bpp[-1].in_pq.pqb.total_size < uVar11) {
      bpp[-1].in_pq.pqb.total_size = uVar11;
      pvVar10 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,uVar11,1);
      *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar10;
    }
    *s = 0x1c2;
LAB_0011c175:
    _Var5 = bufchain_try_fetch_consume
                      (bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
                       (ulong)*(uint *)&bpp[-1].in_pq.after);
    if (!_Var5) goto LAB_0011c459;
    ssh_check_frozen(bpp->ssh);
    plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x28))
                (plVar2,*(undefined8 *)&bpp[-1].in_pq.pqb.end.on_free_queue,
                 *(undefined4 *)&bpp[-1].in_pq.after);
    }
    uVar8 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
    bpp[-1].vt = (BinaryPacketProtocolVtable *)(long)(int)uVar8;
    if ((0x9000 < uVar8) ||
       (puVar17 = (undefined1 *)((long)&((BinaryPacketProtocolVtable *)(long)(int)uVar8)->free + 4),
       (ulong)puVar17 % (ulong)*(uint *)&bpp[-1].in_pq.after != 0)) {
      pSVar22 = bpp->ssh;
      pcVar15 = "Incoming packet was garbled on decryption";
      goto LAB_0011c95d;
    }
    *(undefined1 **)&bpp[-1].input_eof = puVar17;
    pPVar21 = bpp[-1].in_pq.pqb.end.next;
    bpp[-1].in_pq.pqb.end.formal_size = (size_t)(puVar17 + (long)pPVar21);
    pPVar21 = (PacketQueueNode *)safemalloc(1,0x58,(size_t)(puVar17 + (long)pPVar21));
    bpp[-1].out_pq.pqb.end.next = pPVar21;
    *(undefined4 *)&pPVar21->next = 0;
    *(undefined1 *)&pPVar21[1].prev = 0;
    pPVar21->formal_size = 0;
    *(undefined8 *)&pPVar21->on_free_queue = 0;
    bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&pPVar21[2].on_free_queue;
    memcpy(&pPVar21[2].on_free_queue,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
           (ulong)*(uint *)&bpp[-1].in_pq.after);
    bpp[-2].remote_bugs = 0x1eb;
LAB_0011c257:
    uVar11 = (ulong)*(uint *)&bpp[-1].in_pq.after;
    _Var5 = bufchain_try_fetch_consume
                      (bpp->in_raw,(void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + uVar11),
                       (*(long *)&bpp[-1].input_eof - uVar11) + (long)bpp[-1].in_pq.pqb.end.next);
    if (!_Var5) goto LAB_0011c459;
    ssh_check_frozen(bpp->ssh);
    plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
    if (plVar2 != (long *)0x0) {
      uVar7 = *(uint *)&bpp[-1].in_pq.after;
      (**(code **)(*plVar2 + 0x28))
                (plVar2,(long)&(bpp[-1].in_pq.pqb.ic)->fn + (ulong)uVar7,
                 *(int *)&bpp[-1].input_eof - uVar7);
    }
    pIVar20 = bpp[-1].out_pq.pqb.ic;
    if ((pIVar20 != (IdempotentCallback *)0x0) &&
       (_Var5 = ssh2_mac_verify((ssh2_mac *)pIVar20,bpp[-1].in_pq.pqb.ic,*(int *)&bpp[-1].vt + 4,
                                *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue), !_Var5))
    goto LAB_0011c446;
    goto LAB_0011c5d4;
  }
  if (pIVar20 == (IdempotentCallback *)0x0) goto LAB_0011c146;
  bVar16 = *(byte *)&bpp[-1].out_pq.after;
LAB_0011c020:
  if ((bVar16 & 1) == 0) goto LAB_0011c146;
  if (bpp[-1].in_pq.pqb.total_size < 4) {
    bpp[-1].in_pq.pqb.total_size = 4;
    pvVar10 = saferealloc(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,4,1);
    *(void **)&bpp[-1].in_pq.pqb.end.on_free_queue = pvVar10;
  }
  *s = 0x17d;
LAB_0011c05e:
  _Var5 = bufchain_try_fetch_consume(bpp->in_raw,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,4);
  if (_Var5) {
    ssh_check_frozen(bpp->ssh);
    plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
    if ((plVar2 == (long *)0x0) || ((*(byte *)(*plVar2 + 0x54) & 2) == 0)) {
      uVar7 = GET_32BIT_MSB_FIRST(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
    }
    else {
      len = **(uchar (**) [4])&bpp[-1].in_pq.pqb.end.on_free_queue;
      (**(code **)(*plVar2 + 0x38))
                (plVar2,len,4,*(undefined8 *)&bpp[-1].out_pq.pqb.end.on_free_queue);
      uVar7 = (uint)len >> 0x18 | ((uint)len & 0xff0000) >> 8 | ((uint)len & 0xff00) << 8 |
              (int)len << 0x18;
    }
    pBVar18 = (BinaryPacketProtocolVtable *)(long)(int)uVar7;
    bpp[-1].vt = pBVar18;
    if (((BinaryPacketProtocolVtable *)0x9000 < pBVar18) ||
       (uVar7 % *(uint *)&bpp[-1].in_pq.after != 0)) {
      pSVar22 = bpp->ssh;
      pcVar15 = "Incoming packet length field was garbled";
      goto LAB_0011c95d;
    }
    *(undefined1 **)&bpp[-1].input_eof = (undefined1 *)((long)&pBVar18->free + 4);
    pPVar21 = (PacketQueueNode *)safemalloc(1,0x58,(size_t)(bpp[-1].in_pq.pqb.end.next + 0x480));
    bpp[-1].out_pq.pqb.end.next = pPVar21;
    *(undefined4 *)&pPVar21->next = 0;
    *(undefined1 *)&pPVar21[1].prev = 0;
    pPVar21->formal_size = 0;
    *(undefined8 *)&pPVar21->on_free_queue = 0;
    bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&pPVar21[2].on_free_queue;
    *(undefined4 *)&pPVar21[2].on_free_queue = **(undefined4 **)&bpp[-1].in_pq.pqb.end.on_free_queue
    ;
    bpp[-2].remote_bugs = 0x1a9;
LAB_0011c390:
    _Var5 = bufchain_try_fetch_consume
                      (bpp->in_raw,(void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4),
                       (long)bpp[-1].in_pq.pqb.end.next + *(long *)&bpp[-1].input_eof + -4);
    if (!_Var5) goto LAB_0011c459;
    ssh_check_frozen(bpp->ssh);
    pIVar20 = bpp[-1].out_pq.pqb.ic;
    if ((pIVar20 == (IdempotentCallback *)0x0) ||
       (_Var5 = ssh2_mac_verify((ssh2_mac *)pIVar20,bpp[-1].in_pq.pqb.ic,*(int *)&bpp[-1].vt + 4,
                                *(unsigned_long *)&bpp[-1].out_pq.pqb.end.on_free_queue), _Var5)) {
      plVar2 = (long *)bpp[-1].out_pq.pqb.total_size;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x28))
                  (plVar2,(undefined1 *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4),
                   *(int *)&bpp[-1].input_eof + -4);
      }
      goto LAB_0011c5d4;
    }
LAB_0011c446:
    pSVar22 = bpp->ssh;
    pcVar15 = "Incorrect MAC received on packet";
    goto LAB_0011c95d;
  }
LAB_0011c459:
  if (bpp->input_eof == false) {
    return;
  }
  *s = 0x2c9;
  goto LAB_0011c46a;
code_r0x0011c588:
  addend = (long)&(bpp[-1].in_pq.pqb.end.next)->next + lVar19;
  bpp[-1].in_pq.pqb.end.formal_size = addend;
  pPVar21 = (PacketQueueNode *)safemalloc(1,0x58,addend);
  bpp[-1].out_pq.pqb.end.next = pPVar21;
  *(undefined4 *)&pPVar21->next = 0;
  *(undefined1 *)&pPVar21[1].prev = 0;
  pPVar21->formal_size = 0;
  *(undefined8 *)&pPVar21->on_free_queue = 0;
  bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&pPVar21[2].on_free_queue;
  memcpy(&pPVar21[2].on_free_queue,*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue,
         bpp[-1].in_pq.pqb.end.formal_size);
LAB_0011c5d4:
  pbVar13 = (bufchain *)(ulong)*(byte *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 4);
  bpp[-1].in_raw = pbVar13;
  if ((pbVar13 < (bufchain *)0x4) ||
     (lVar19 = (long)bpp[-1].vt - (long)pbVar13, lVar19 == 0 || (long)bpp[-1].vt < (long)pbVar13)) {
    pSVar22 = bpp->ssh;
    pcVar15 = "Invalid padding length on received packet";
LAB_0011c95d:
    ssh_sw_abort(pSVar22,pcVar15);
    bpp[-2].remote_bugs = 0;
    return;
  }
  bpp[-1].out_raw = (bufchain *)(lVar19 + -1);
  bpp[-1].in_pq.pqb.end.prev = (PacketQueueNode *)(lVar19 + 4);
  dts_consume((DataTransferStatsDirection *)bpp[-1].out_pq.pqb.end.prev,
              *(unsigned_long *)&bpp[-1].input_eof);
  pPVar21 = bpp[-1].out_pq.pqb.end.next;
  pPVar3 = *(PacketQueueNode **)&bpp[-1].out_pq.pqb.end.on_free_queue;
  *(undefined1 **)&bpp[-1].out_pq.pqb.end.on_free_queue = (undefined1 *)((long)&pPVar3->next + 1);
  pPVar21->prev = pPVar3;
  pPVar21 = (PacketQueueNode *)(*(long *)&bpp[-1].input_eof - (long)bpp[-1].in_raw);
  bpp[-1].in_pq.pqb.end.prev = pPVar21;
  if ((long)pPVar21 < 0) {
    __assert_fail("s->length >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x20f,"void ssh2_bpp_handle_input(BinaryPacketProtocol *)");
  }
  p_Var4 = bpp[-1].ic_out_pq.fn;
  if ((p_Var4 != (toplevel_callback_fn_t)0x0) &&
     (cVar6 = (**(code **)(*(long *)p_Var4 + 0x38))
                        (p_Var4,(undefined1 *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5),
                         (int)pPVar21 + -5,len,&newlen), cVar6 != '\0')) {
    pPVar21 = (PacketQueueNode *)((long)newlen + 5);
    if ((long)bpp[-1].in_pq.pqb.end.formal_size < (long)pPVar21) {
      pPVar3 = bpp[-1].out_pq.pqb.end.next;
      bpp[-1].in_pq.pqb.end.formal_size = (size_t)pPVar21;
      pPVar14 = (PacketQueueNode *)safemalloc(1,0x58,(size_t)pPVar21);
      bpp[-1].out_pq.pqb.end.next = pPVar14;
      pPVar21 = pPVar3;
      for (lVar19 = 0xb; lVar19 != 0; lVar19 = lVar19 + -1) {
        pPVar14->next = pPVar21->next;
        pPVar21 = (PacketQueueNode *)((long)pPVar21 + ((ulong)bVar23 * -2 + 1) * 8);
        pPVar14 = (PacketQueueNode *)((long)pPVar14 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      pPVar21 = bpp[-1].in_pq.pqb.end.next;
      bpp[-1].in_pq.pqb.ic = (IdempotentCallback *)&bpp[-1].out_pq.pqb.end.next[2].on_free_queue;
      smemclr(pPVar3,(long)&pPVar21->next + *(long *)&bpp[-1].input_eof);
      safefree(pPVar3);
      pPVar21 = (PacketQueueNode *)((long)newlen + 5);
    }
    bpp[-1].in_pq.pqb.end.prev = pPVar21;
    memcpy((void *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5),(void *)CONCAT44(iStack_64,len),
           (long)newlen);
    safefree((void *)CONCAT44(iStack_64,len));
  }
  pPVar21 = bpp[-1].in_pq.pqb.end.prev;
  if ((long)pPVar21 < 6) {
    pPVar12 = (PktIn *)bpp[-1].out_pq.pqb.end.next;
    pPVar12->type = 0x100;
    pIVar20 = (IdempotentCallback *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + 5);
    uVar7 = 0x100;
    pPVar21 = (PacketQueueNode *)0x0;
  }
  else {
    pIVar20 = bpp[-1].in_pq.pqb.ic;
    pPVar12 = (PktIn *)bpp[-1].out_pq.pqb.end.next;
    bVar16 = *(byte *)((long)&pIVar20->fn + 5);
    uVar7 = (uint)bVar16;
    pPVar12->type = (uint)bVar16;
    pIVar20 = (IdempotentCallback *)((long)&pIVar20->fn + 6);
    pPVar21 = (PacketQueueNode *)&pPVar21[-1].field_0x1a;
  }
  bpp[-1].in_pq.pqb.ic = pIVar20;
  bpp[-1].in_pq.pqb.end.prev = pPVar21;
  pPVar12->binarysource_[0].data = pIVar20;
  pPVar12->binarysource_[0].len = (size_t)pPVar21;
  pPVar12->binarysource_[0].pos = 0;
  pPVar12->binarysource_[0].err = BSE_NO_ERROR;
  pPVar12->binarysource_[0].binarysource_ = pPVar12->binarysource_;
  if (bpp->logctx != (LogContext *)0x0) {
    pkt.len = (size_t)pPVar21;
    pkt.ptr = pIVar20;
    iVar9 = ssh2_censor_packet(bpp->pls,uVar7,false,pkt,(logblank_t *)len);
    ctx = bpp->logctx;
    iVar1 = *(int *)&(bpp[-1].out_pq.pqb.end.next)->next;
    pcVar15 = ssh2_pkt_type(bpp->pls->kctx,bpp->pls->actx,iVar1);
    log_packet(ctx,0,iVar1,pcVar15,bpp[-1].in_pq.pqb.ic,(size_t)bpp[-1].in_pq.pqb.end.prev,iVar9,
               (logblank_t *)len,(unsigned_long *)&(bpp[-1].out_pq.pqb.end.next)->prev,0,(char *)0x0
              );
    pPVar12 = (PktIn *)bpp[-1].out_pq.pqb.end.next;
  }
  _Var5 = ssh2_bpp_check_unimplemented(bpp,pPVar12);
  pPVar21 = bpp[-1].out_pq.pqb.end.next;
  if (_Var5) {
    safefree(pPVar21);
    bpp[-1].out_pq.pqb.end.next = (PacketQueueNode *)0x0;
    goto LAB_0011bfbe;
  }
  pPVar21[1].next = (PacketQueueNode *)((long)pPVar21[2].next - *(long *)&pPVar21[1].on_free_queue);
  pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)&pPVar21->formal_size);
  iVar1 = *(int *)&(bpp[-1].out_pq.pqb.end.next)->next;
  iVar9._0_1_ = bpp[-1].ext_info_rsa_sha256_ok;
  iVar9._1_1_ = bpp[-1].ext_info_rsa_sha512_ok;
  iVar9._2_1_ = bpp[-1].expect_close;
  iVar9._3_1_ = bpp[-1].field_0xdf;
  bpp[-1].ext_info_rsa_sha256_ok = (_Bool)(char)iVar1;
  bpp[-1].ext_info_rsa_sha512_ok = (_Bool)(char)((uint)iVar1 >> 8);
  bpp[-1].expect_close = (_Bool)(char)((uint)iVar1 >> 0x10);
  bpp[-1].field_0xdf = (char)((uint)iVar1 >> 0x18);
  bpp[-1].out_pq.pqb.end.next = (PacketQueueNode *)0x0;
  if (bpp[-1].ic_out_pq.field_0x14 == '\x01') {
    if (iVar1 != 0x34) {
      pSVar22 = bpp->ssh;
      pcVar15 = 
      "Remote side sent SSH2_MSG_EXT_INFO not either preceded by NEWKEYS or followed by USERAUTH_SUCCESS"
      ;
      goto LAB_0011c988;
    }
    bpp[-1].ic_out_pq.field_0x14 = 0;
  }
  else {
    if (iVar1 == 7) {
      if ((iVar9 != 0x15) || (bpp[-1].remote_bugs != 1)) {
        if (bpp[-1].ic_out_pq.queued == true) {
          pSVar22 = bpp->ssh;
          pcVar15 = 
          "Remote side sent SSH2_MSG_EXT_INFO that was not immediately after the initial NEWKEYS";
        }
        else {
          if ((bpp[-1].remote_bugs == 0) || (bpp[-1].ic_out_pq.field_0x13 != '\x01')) {
            bpp[-1].ic_out_pq.field_0x14 = 1;
            goto LAB_0011c926;
          }
          pSVar22 = bpp->ssh;
          pcVar15 = "Remote side sent SSH2_MSG_EXT_INFO after USERAUTH_SUCCESS";
        }
LAB_0011c988:
        ssh_proto_error(pSVar22,pcVar15);
        return;
      }
      goto LAB_0011c926;
    }
    if (iVar1 != 0x34) {
      if (iVar1 == 0x15) {
        if ((uint)bpp[-1].remote_bugs < 2) {
          bpp[-1].remote_bugs = bpp[-1].remote_bugs + 1;
        }
        bpp[-1].ic_out_pq.field_0x11 = 1;
        bpp[-2].remote_bugs = 0x272;
        return;
      }
      goto LAB_0011c926;
    }
  }
  if (bpp[-1].ic_out_pq.queued == false) {
    ssh2_bpp_enable_pending_compression((ssh2_bpp_state *)s);
    bpp[-1].ic_out_pq.field_0x13 = 1;
  }
LAB_0011c926:
  if ((iVar1 - 0x32U < 0x14 & bpp[-1].ic_out_pq.field_0x12) == 1) {
    bpp[-1].ic_out_pq.field_0x12 = 0;
    queue_idempotent_callback(&bpp->ic_out_pq);
  }
  goto LAB_0011bfbe;
}

Assistant:

static void ssh2_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh2_bpp_state *s = container_of(bpp, struct ssh2_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        s->maxlen = 0;
        s->length = 0;
        if (s->in.cipher)
            s->cipherblk = ssh_cipher_alg(s->in.cipher)->blksize;
        else
            s->cipherblk = 8;
        if (s->cipherblk < 8)
            s->cipherblk = 8;
        s->maclen = s->in.mac ? ssh2_mac_alg(s->in.mac)->len : 0;

        if (s->in.cipher &&
            (ssh_cipher_alg(s->in.cipher)->flags & SSH_CIPHER_IS_CBC) &&
            s->in.mac && !s->in.etm_mode) {
            /*
             * When dealing with a CBC-mode cipher, we want to avoid the
             * possibility of an attacker's tweaking the ciphertext stream
             * so as to cause us to feed the same block to the block
             * cipher more than once and thus leak information
             * (VU#958563).  The way we do this is not to take any
             * decisions on the basis of anything we've decrypted until
             * we've verified it with a MAC.  That includes the packet
             * length, so we just read data and check the MAC repeatedly,
             * and when the MAC passes, see if the length we've got is
             * plausible.
             *
             * This defence is unnecessary in OpenSSH ETM mode, because
             * the whole point of ETM mode is that the attacker can't
             * tweak the ciphertext stream at all without the MAC
             * detecting it before we decrypt anything.
             */

            /*
             * Make sure we have buffer space for a maximum-size packet.
             */
            unsigned buflimit = OUR_V2_PACKETLIMIT + s->maclen;
            if (s->bufsize < buflimit) {
                s->bufsize = buflimit;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /* Read an amount corresponding to the MAC. */
            BPP_READ(s->buf, s->maclen);

            s->packetlen = 0;
            ssh2_mac_start(s->in.mac);
            put_uint32(s->in.mac, s->in.sequence);

            for (;;) { /* Once around this loop per cipher block. */
                /* Read another cipher-block's worth, and tack it on to
                 * the end. */
                BPP_READ(s->buf + (s->packetlen + s->maclen), s->cipherblk);
                /* Decrypt one more block (a little further back in
                 * the stream). */
                ssh_cipher_decrypt(s->in.cipher,
                                   s->buf + s->packetlen, s->cipherblk);

                /* Feed that block to the MAC. */
                put_data(s->in.mac,
                         s->buf + s->packetlen, s->cipherblk);
                s->packetlen += s->cipherblk;

                /* See if that gives us a valid packet. */
                if (ssh2_mac_verresult(s->in.mac, s->buf + s->packetlen) &&
                    ((s->len = toint(GET_32BIT_MSB_FIRST(s->buf))) ==
                     s->packetlen-4))
                    break;
                if (s->packetlen >= (long)OUR_V2_PACKETLIMIT) {
                    ssh_sw_abort(s->bpp.ssh,
                                 "No valid incoming packet found");
                    crStopV;
                }
            }
            s->maxlen = s->packetlen + s->maclen;

            /*
             * Now transfer the data into an output packet.
             */
            s->pktin = snew_plus(PktIn, s->maxlen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, s->maxlen);
        } else if (s->in.mac && s->in.etm_mode) {
            if (s->bufsize < 4) {
                s->bufsize = 4;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /*
             * OpenSSH encrypt-then-MAC mode: the packet length is
             * unencrypted, unless the cipher supports length encryption.
             */
            BPP_READ(s->buf, 4);

            /* Cipher supports length decryption, so do it */
            if (s->in.cipher && (ssh_cipher_alg(s->in.cipher)->flags &
                                 SSH_CIPHER_SEPARATE_LENGTH)) {
                /* Keep the packet the same though, so the MAC passes */
                unsigned char len[4];
                memcpy(len, s->buf, 4);
                ssh_cipher_decrypt_length(
                    s->in.cipher, len, 4, s->in.sequence);
                s->len = toint(GET_32BIT_MSB_FIRST(len));
            } else {
                s->len = toint(GET_32BIT_MSB_FIRST(s->buf));
            }

            /*
             * _Completely_ silly lengths should be stomped on before they
             * do us any more damage.
             */
            if (s->len < 0 || s->len > (long)OUR_V2_PACKETLIMIT ||
                s->len % s->cipherblk != 0) {
                ssh_sw_abort(s->bpp.ssh,
                             "Incoming packet length field was garbled");
                crStopV;
            }

            /*
             * So now we can work out the total packet length.
             */
            s->packetlen = s->len + 4;

            /*
             * Allocate the packet to return, now we know its length.
             */
            s->pktin = snew_plus(PktIn, OUR_V2_PACKETLIMIT + s->maclen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, 4);

            /*
             * Read the remainder of the packet.
             */
            BPP_READ(s->data + 4, s->packetlen + s->maclen - 4);

            /*
             * Check the MAC.
             */
            if (s->in.mac && !ssh2_mac_verify(
                    s->in.mac, s->data, s->len + 4, s->in.sequence)) {
                ssh_sw_abort(s->bpp.ssh, "Incorrect MAC received on packet");
                crStopV;
            }

            /* Decrypt everything between the length field and the MAC. */
            if (s->in.cipher)
                ssh_cipher_decrypt(
                    s->in.cipher, s->data + 4, s->packetlen - 4);
        } else {
            if (s->bufsize < s->cipherblk) {
                s->bufsize = s->cipherblk;
                s->buf = sresize(s->buf, s->bufsize, unsigned char);
            }

            /*
             * Acquire and decrypt the first block of the packet. This will
             * contain the length and padding details.
             */
            BPP_READ(s->buf, s->cipherblk);

            if (s->in.cipher)
                ssh_cipher_decrypt(s->in.cipher, s->buf, s->cipherblk);

            /*
             * Now get the length figure.
             */
            s->len = toint(GET_32BIT_MSB_FIRST(s->buf));

            /*
             * _Completely_ silly lengths should be stomped on before they
             * do us any more damage.
             */
            if (s->len < 0 || s->len > (long)OUR_V2_PACKETLIMIT ||
                (s->len + 4) % s->cipherblk != 0) {
                ssh_sw_abort(s->bpp.ssh,
                             "Incoming packet was garbled on decryption");
                crStopV;
            }

            /*
             * So now we can work out the total packet length.
             */
            s->packetlen = s->len + 4;

            /*
             * Allocate the packet to return, now we know its length.
             */
            s->maxlen = s->packetlen + s->maclen;
            s->pktin = snew_plus(PktIn, s->maxlen);
            s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
            s->pktin->type = 0;
            s->pktin->qnode.on_free_queue = false;
            s->data = snew_plus_get_aux(s->pktin);
            memcpy(s->data, s->buf, s->cipherblk);

            /*
             * Read and decrypt the remainder of the packet.
             */
            BPP_READ(s->data + s->cipherblk,
                     s->packetlen + s->maclen - s->cipherblk);

            /* Decrypt everything _except_ the MAC. */
            if (s->in.cipher)
                ssh_cipher_decrypt(
                    s->in.cipher,
                    s->data + s->cipherblk, s->packetlen - s->cipherblk);

            /*
             * Check the MAC.
             */
            if (s->in.mac && !ssh2_mac_verify(
                    s->in.mac, s->data, s->len + 4, s->in.sequence)) {
                ssh_sw_abort(s->bpp.ssh, "Incorrect MAC received on packet");
                crStopV;
            }
        }
        /* Get and sanity-check the amount of random padding. */
        s->pad = s->data[4];
        if (s->pad < 4 || s->len - s->pad < 1) {
            ssh_sw_abort(s->bpp.ssh,
                         "Invalid padding length on received packet");
            crStopV;
        }
        /*
         * This enables us to deduce the payload length.
         */
        s->payload = s->len - s->pad - 1;

        s->length = s->payload + 5;

        dts_consume(&s->stats->in, s->packetlen);

        s->pktin->sequence = s->in.sequence++;

        s->length = s->packetlen - s->pad;
        assert(s->length >= 0);

        /*
         * Decompress packet payload.
         */
        {
            unsigned char *newpayload;
            int newlen;
            if (s->in_decomp && ssh_decompressor_decompress(
                    s->in_decomp, s->data + 5, s->length - 5,
                    &newpayload, &newlen)) {
                if (s->maxlen < newlen + 5) {
                    PktIn *old_pktin = s->pktin;

                    s->maxlen = newlen + 5;
                    s->pktin = snew_plus(PktIn, s->maxlen);
                    *s->pktin = *old_pktin; /* structure copy */
                    s->data = snew_plus_get_aux(s->pktin);

                    smemclr(old_pktin, s->packetlen + s->maclen);
                    sfree(old_pktin);
                }
                s->length = 5 + newlen;
                memcpy(s->data + 5, newpayload, newlen);
                sfree(newpayload);
            }
        }

        /*
         * Now we can identify the semantic content of the packet,
         * and also the initial type byte.
         */
        if (s->length <= 5) { /* == 5 we hope, but robustness */
            /*
             * RFC 4253 doesn't explicitly say that completely empty
             * packets with no type byte are forbidden. We handle them
             * here by giving them a type code larger than 0xFF, which
             * will be picked up at the next layer and trigger
             * SSH_MSG_UNIMPLEMENTED.
             */
            s->pktin->type = SSH_MSG_NO_TYPE_CODE;
            s->data += 5;
            s->length = 0;
        } else {
            s->pktin->type = s->data[5];
            s->data += 6;
            s->length -= 6;
        }
        BinarySource_INIT(s->pktin, s->data, s->length);

        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh2_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->length), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                     s->pktin->type),
                       s->data, s->length, nblanks, blanks,
                       &s->pktin->sequence, 0, NULL);
        }

        if (ssh2_bpp_check_unimplemented(&s->bpp, s->pktin)) {
            sfree(s->pktin);
            s->pktin = NULL;
            continue;
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);

        {
            int type = s->pktin->type;
            int prev_type = s->prev_type;
            s->prev_type = type;
            s->pktin = NULL;

            if (s->enforce_next_packet_is_userauth_success) {
                /* See EXT_INFO handler below */
                if (type != SSH2_MSG_USERAUTH_SUCCESS) {
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "not either preceded by NEWKEYS or "
                                    "followed by USERAUTH_SUCCESS");
                    return;
                }
                s->enforce_next_packet_is_userauth_success = false;
            }

            if (type == SSH2_MSG_NEWKEYS) {
                if (s->nnewkeys < 2)
                    s->nnewkeys++;
                /*
                 * Mild layer violation: in this situation we must
                 * suspend processing of the input byte stream until
                 * the transport layer has initialised the new keys by
                 * calling ssh2_bpp_new_incoming_crypto above.
                 */
                s->pending_newkeys = true;
                crWaitUntilV(!s->pending_newkeys);
                continue;
            }

            if (type == SSH2_MSG_USERAUTH_SUCCESS && !s->is_server) {
                /*
                 * Another one: if we were configured with OpenSSH's
                 * deferred compression which is triggered on receipt
                 * of USERAUTH_SUCCESS, then this is the moment to
                 * turn on compression.
                 */
                ssh2_bpp_enable_pending_compression(s);

                /*
                 * Whether or not we were doing delayed compression in
                 * _this_ set of crypto parameters, we should set a
                 * flag indicating that we're now authenticated, so
                 * that a delayed compression method enabled in any
                 * future rekey will be treated as un-delayed.
                 */
                s->seen_userauth_success = true;
            }

            if (type == SSH2_MSG_EXT_INFO) {
                /*
                 * And another: enforce that an incoming EXT_INFO is
                 * either the message immediately after the initial
                 * NEWKEYS, or (if we're the client) the one
                 * immediately before USERAUTH_SUCCESS.
                 */
                if (prev_type == SSH2_MSG_NEWKEYS && s->nnewkeys == 1) {
                    /* OK - this is right after the first NEWKEYS. */
                } else if (s->is_server) {
                    /* We're the server, so they're the client.
                     * Clients may not send EXT_INFO at _any_ other
                     * time. */
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "that was not immediately after the "
                                    "initial NEWKEYS");
                    return;
                } else if (s->nnewkeys > 0 && s->seen_userauth_success) {
                    /* We're the client, so they're the server. In
                     * that case they may also send EXT_INFO
                     * immediately before USERAUTH_SUCCESS. Error out
                     * immediately if this can't _possibly_ be that
                     * moment (because we haven't even seen NEWKEYS
                     * yet, or because we've already seen
                     * USERAUTH_SUCCESS). */
                    ssh_proto_error(s->bpp.ssh,
                                    "Remote side sent SSH2_MSG_EXT_INFO "
                                    "after USERAUTH_SUCCESS");
                    return;
                } else {
                    /* This _could_ be OK, provided the next packet is
                     * USERAUTH_SUCCESS. Set a flag to remember to
                     * fault it if not. */
                    s->enforce_next_packet_is_userauth_success = true;
                }
            }

            if (s->pending_compression && userauth_range(type)) {
                /*
                 * Receiving any userauth message at all indicates
                 * that we're not about to turn on delayed compression
                 * - either because we just _have_ done, or because
                 * this message is a USERAUTH_FAILURE or some kind of
                 * intermediate 'please send more data' continuation
                 * message. Either way, we turn off the outgoing
                 * packet blockage for now, and release any queued
                 * output packets, so that we can make another attempt
                 * to authenticate. The next userauth packet we send
                 * will re-block the output direction.
                 */
                s->pending_compression = false;
                queue_idempotent_callback(&s->bpp.ic_out_pq);
            }
        }
    }

  eof:
    /*
     * We've seen EOF. But we might have pushed stuff on the outgoing
     * packet queue first, and that stuff _might_ include a DISCONNECT
     * message, in which case we'd like to use that as the diagnostic.
     * So first wait for the queue to have been processed.
     */
    crMaybeWaitUntilV(!pq_peek(&s->bpp.in_pq));
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}